

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

void other(void)

{
  ostream *this;
  LogStream *this_00;
  string *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_stack_ffffffffffffefb8;
  int v_00;
  Logger *in_stack_ffffffffffffefc0;
  allocator<char> *in_stack_ffffffffffffeff0;
  char *in_stack_ffffffffffffeff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff000;
  Logger local_fd8;
  
  this = std::operator<<((ostream *)&std::cout,
                         "---------------------other test-----------------------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Logger::Logger(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,0);
  Logger::stream(&local_fd8);
  LogStream::operator<<((LogStream *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  v_00 = (int)((ulong)in_stack_ffffffffffffefb8 >> 0x20);
  this_00 = LogStream::operator<<
                      ((LogStream *)in_stack_ffffffffffffefc0,
                       (char)((ulong)in_stack_ffffffffffffefb8 >> 0x38));
  v = (string *)LogStream::operator<<((LogStream *)in_stack_ffffffffffffefc0,v_00);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            LogStream::operator<<(this_00,(double)v);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0);
  LogStream::operator<<(this_00,v);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffeff7);
  Logger::~Logger((Logger *)in_stack_fffffffffffff000);
  return;
}

Assistant:

void other(){
    // 1 line
    cout<<"---------------------other test-----------------------"<<endl;
    LOG<<"fddsa"<<'c'<<0<<3.12<<string("this is a string");
}